

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_crm.cc
# Opt level: O1

void __thiscall aliyun::Crm::~Crm(Crm *this)

{
  free(this->appid_);
  free(this->secret_);
  free(this->host_);
  if (this->region_id_ != (char *)0x0) {
    free(this->region_id_);
  }
  if (this->proxy_host_ != (char *)0x0) {
    free(this->proxy_host_);
    return;
  }
  return;
}

Assistant:

Crm::~Crm() {
    free(appid_);
    free(secret_);
    free(host_);
    if(region_id_) free(region_id_);
    if(proxy_host_) free(proxy_host_);
  }